

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O1

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::NBestEncode
          (NBestEncodeResult *__return_storage_ptr__,ModelInterface *this,string_view normalized,
          int nbest_size)

{
  int iVar1;
  ulong in_RAX;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 3) {
    uStack_18 = uStack_18 & 0xffffffffffffff;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"model_interface.h",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LOG(",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ERROR",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Not implemented.",0x10);
    error::Die::~Die((Die *)((long)&uStack_18 + 7));
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

virtual NBestEncodeResult NBestEncode(absl::string_view normalized,
                                        int nbest_size) const {
    LOG(ERROR) << "Not implemented.";
    return NBestEncodeResult();
  }